

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O2

Aig_Man_t *
createMonotoneTester
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,monotoneVectorsStruct *monotoneVectorArg,
          int *startMonotonePropPo)

{
  int iVar1;
  Vec_Int_t *vKnownMonotone;
  Vec_Int_t *vCandMonotone;
  Vec_Int_t *vHintMonotone;
  int iVar2;
  int iVar3;
  Aig_Man_t *p;
  size_t sVar4;
  char *__s;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *p0;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  ulong uVar9;
  Aig_Obj_t *pAVar10;
  int iVar11;
  int iVar12;
  int i;
  Vec_Ptr_t *p_03;
  int iVar13;
  uint uVar14;
  int iVar15;
  Aig_Obj_t *local_78;
  
  iVar15 = aigPoIndicesArg->attrPendingSignalIndex;
  iVar3 = aigPoIndicesArg->attrHintSingalBeginningMarker;
  vKnownMonotone = monotoneVectorArg->attrKnownMonotone;
  vCandMonotone = monotoneVectorArg->attrCandMonotone;
  vHintMonotone = monotoneVectorArg->attrHintMonotone;
  p = Aig_ManStart(pAig->vObjs->nSize);
  sVar4 = strlen(pAig->pName);
  __s = (char *)malloc(sVar4 + 10);
  p->pName = __s;
  sprintf(__s,"%s_%s",pAig->pName,"_monotone");
  p->pSpec = (char *)0x0;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  for (iVar11 = 0; iVar11 < pAig->nTruePis; iVar11 = iVar11 + 1) {
    pvVar5 = Vec_PtrEntry(pAig->vCis,iVar11);
    pAVar6 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar6;
  }
  for (iVar11 = 0; iVar11 < pAig->nRegs; iVar11 = iVar11 + 1) {
    pvVar5 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar11);
    pAVar6 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar6;
  }
  pAVar6 = Aig_ObjCreateCi(p);
  p_00 = Vec_PtrAlloc(vHintMonotone->nSize);
  for (iVar12 = 0; iVar12 < vHintMonotone->nSize; iVar12 = iVar12 + 1) {
    Vec_IntEntry(vHintMonotone,iVar12);
    pAVar7 = Aig_ObjCreateCi(p);
    Vec_PtrPush(p_00,pAVar7);
    iVar11 = iVar11 + 1;
  }
  iVar12 = iVar11 + 1;
  printf("\nnRegCount = %d\n");
  for (iVar13 = 0; iVar13 < pAig->vObjs->nSize; iVar13 = iVar13 + 1) {
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar13);
    if ((pAVar7 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar7->field_0x18 & 7) - 7)) {
      pAVar8 = Aig_ObjChild0Copy(pAVar7);
      if (((ulong)pAVar7 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
      }
      uVar9 = (ulong)pAVar7->pFanin1 & 0xfffffffffffffffe;
      if (uVar9 == 0) {
        pAVar10 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar10 = (Aig_Obj_t *)((ulong)((uint)pAVar7->pFanin1 & 1) ^ *(ulong *)(uVar9 + 0x28));
      }
      pAVar8 = Aig_And(p,pAVar8,pAVar10);
      (pAVar7->field_5).pData = pAVar8;
    }
  }
  pAVar7 = Aig_ManCo(pAig,iVar15);
  pAVar7 = pAVar7->pFanin0;
  if (((ulong)pAVar7 & 1) == 0) {
    pAVar7 = (Aig_Obj_t *)(pAVar7->field_5).pData;
  }
  else {
    pAVar7 = (Aig_Obj_t *)(*(ulong *)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x28) ^ 1);
  }
  local_78 = Aig_And(p,pAVar7,pAVar6);
  if (vKnownMonotone != (Vec_Int_t *)0x0) {
    iVar13 = pAig->nRegs;
    iVar1 = pAig->nObjs[3];
    pAVar6 = p->pConst1;
    checkSanityOfKnownMonotone(vKnownMonotone,vCandMonotone,vHintMonotone);
    for (i = 0; i < vKnownMonotone->nSize; i = i + 1) {
      iVar2 = Vec_IntEntry(vKnownMonotone,i);
      uVar14 = iVar2 + (iVar15 - iVar3) + 1;
      printf("\nProcessing knownMonotone = %d\n",(ulong)uVar14);
      pAVar8 = Aig_ManCo(pAig,uVar14);
      pAVar8 = pAVar8->pFanin0;
      if (((ulong)pAVar8 & 1) == 0) {
        pAVar8 = (Aig_Obj_t *)(pAVar8->field_5).pData;
      }
      else {
        pAVar8 = (Aig_Obj_t *)(*(ulong *)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x28) ^ 1);
      }
      pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(p_00,uVar14 + (iVar13 - iVar1));
      p0 = Aig_And(p,pAVar8,pAVar10);
      pAVar8 = Aig_And(p,(Aig_Obj_t *)((ulong)pAVar8 ^ 1),(Aig_Obj_t *)((ulong)pAVar10 ^ 1));
      pAVar8 = Aig_Or(p,p0,pAVar8);
      pAVar6 = Aig_And(p,pAVar6,pAVar8);
    }
    local_78 = Aig_And(p,local_78,pAVar6);
  }
  p_01 = Vec_PtrAlloc(vHintMonotone->nSize);
  p_02 = Vec_PtrAlloc(vHintMonotone->nSize);
  for (iVar15 = 0; iVar15 < vHintMonotone->nSize; iVar15 = iVar15 + 1) {
    iVar3 = Vec_IntEntry(vHintMonotone,iVar15);
    pAVar6 = Aig_ManCo(pAig,iVar3);
    pAVar6 = pAVar6->pFanin0;
    if (((ulong)pAVar6 & 1) == 0) {
      pAVar6 = (Aig_Obj_t *)(pAVar6->field_5).pData;
    }
    else {
      pAVar6 = (Aig_Obj_t *)(*(ulong *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x28) ^ 1);
    }
    if ((vKnownMonotone == (Vec_Int_t *)0x0) ||
       (iVar13 = Vec_IntFind(vKnownMonotone,iVar3), p_03 = p_01, iVar13 == -1)) {
      iVar3 = Vec_IntFind(vHintMonotone,iVar3);
      pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar3);
      pAVar8 = Aig_And(p,local_78,pAVar8);
      pAVar8 = Aig_Or(p,(Aig_Obj_t *)((ulong)pAVar8 ^ 1),pAVar6);
      Vec_PtrPush(p_01,pAVar6);
      pAVar6 = pAVar8;
      p_03 = p_02;
    }
    Vec_PtrPush(p_03,pAVar6);
  }
  for (uVar14 = 0; (int)uVar14 < pAig->nTruePos; uVar14 = uVar14 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,uVar14);
    pAVar8 = Aig_ObjChild0Copy(pAVar6);
    pAVar8 = Aig_ObjCreateCo(p,pAVar8);
    (pAVar6->field_5).pData = pAVar8;
  }
  *startMonotonePropPo = uVar14;
  uVar9 = (ulong)(uint)p_02->nSize;
  iVar15 = 0;
  if (p_02->nSize < 1) {
    uVar9 = 0;
    iVar15 = 0;
  }
  for (; (int)uVar9 != iVar15; iVar15 = iVar15 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_02,iVar15);
    Aig_ObjCreateCo(p,pAVar6);
  }
  for (iVar15 = 0; iVar15 < pAig->nRegs; iVar15 = iVar15 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar15);
    pAVar6 = Aig_ObjChild0Copy(pAVar6);
    Aig_ObjCreateCo(p,pAVar6);
    iVar11 = iVar11 + -1;
  }
  Aig_ObjCreateCo(p,pAVar7);
  iVar15 = p_01->nSize;
  iVar3 = 0;
  if (iVar15 < 1) {
    iVar15 = 0;
  }
  for (; iVar15 != iVar3; iVar3 = iVar3 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_01,iVar3);
    Aig_ObjCreateCo(p,pAVar6);
  }
  printf("\npoCopied = %d, poCreated = %d\n",(ulong)uVar14,uVar9);
  printf("\nliCreated++ = %d\n",(ulong)(iVar15 + 1));
  Aig_ManSetRegNum(p,iVar12);
  Aig_ManCleanup(p);
  iVar3 = Aig_ManCheck(p);
  if (iVar3 == 0) {
    __assert_fail("Aig_ManCheck( pNewAig )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/monotone.c"
                  ,0x154,
                  "Aig_Man_t *createMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct monotoneVectorsStruct *, int *)"
                 );
  }
  if (iVar15 != iVar11) {
    __assert_fail("loCopied + loCreated == liCopied + liCreated",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/monotone.c"
                  ,0x155,
                  "Aig_Man_t *createMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct monotoneVectorsStruct *, int *)"
                 );
  }
  printf("\nSaig_ManPoNum = %d\n",(ulong)(uint)p->nTruePos);
  return p;
}

Assistant:

Aig_Man_t *createMonotoneTester(Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, struct monotoneVectorsStruct *monotoneVectorArg, int *startMonotonePropPo)
{
	Aig_Man_t *pNewAig;
	int iElem, i, nRegCount, oldPoNum, poSerialNum, iElemHint;
	int piCopied = 0, liCopied = 0, liCreated = 0, loCopied = 0, loCreated = 0;
	int poCopied = 0, poCreated = 0;
	Aig_Obj_t *pObj, *pObjPo, *pObjDriver, *pObjDriverNew, *pObjPendingDriverNew, *pObjPendingAndNextPending;
	Aig_Obj_t *pPendingFlop, *pHintSignalLo, *pHintMonotoneFlop, *pObjTemp1, *pObjTemp2, *pObjKnownMonotoneAnd;
	Vec_Ptr_t *vHintMonotoneLocalDriverNew;
	Vec_Ptr_t *vHintMonotoneLocalFlopOutput;
	Vec_Ptr_t *vHintMonotoneLocalProp;

	int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;
	int hintSingalBeginningMarkerLocal = aigPoIndicesArg->attrHintSingalBeginningMarker;
	//int hintSingalEndMarkerLocal = aigPoIndicesArg->attrHintSingalEndMarker;

	Vec_Int_t *vKnownMonotoneLocal = monotoneVectorArg->attrKnownMonotone;
	Vec_Int_t *vCandMonotoneLocal = monotoneVectorArg->attrCandMonotone;
	Vec_Int_t *vHintMonotoneLocal = monotoneVectorArg->attrHintMonotone;
	
	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_monotone") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "_monotone");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//****************************************************************
	// Step 6: create "D" register output for PENDING flop 
	//****************************************************************
	loCreated++;
	pPendingFlop = Aig_ObjCreateCi( pNewAig );

	//****************************************************************
	// Step 6.a: create "D" register output for HINT_MONOTONE flop 
	//****************************************************************
	vHintMonotoneLocalFlopOutput = Vec_PtrAlloc(Vec_IntSize(vHintMonotoneLocal));
	Vec_IntForEachEntry( vHintMonotoneLocal, iElem, i )
	{
		loCreated++;
		pHintMonotoneFlop = Aig_ObjCreateCi( pNewAig );
		Vec_PtrPush( vHintMonotoneLocalFlopOutput, pHintMonotoneFlop );
	}

	nRegCount = loCreated + loCopied;
	printf("\nnRegCount = %d\n", nRegCount);

	//********************************************************************
	// Step 7: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}
	
	//********************************************************************
	// Step 8: mapping appropriate new flop drivers 
	//********************************************************************

	pObjPo = Aig_ManCo( pAig, pendingSignalIndexLocal );
	pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
	pObjPendingDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

	pObjPendingAndNextPending = Aig_And( pNewAig, pObjPendingDriverNew, pPendingFlop );

	oldPoNum = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);
	pObjKnownMonotoneAnd = Aig_ManConst1( pNewAig );
	#if 1
	if( vKnownMonotoneLocal )
	{
		assert( checkSanityOfKnownMonotone( vKnownMonotoneLocal, vCandMonotoneLocal, vHintMonotoneLocal ) );

		Vec_IntForEachEntry( vKnownMonotoneLocal, iElemHint, i )
		{
			iElem = (iElemHint - hintSingalBeginningMarkerLocal) + 1 + pendingSignalIndexLocal;
			printf("\nProcessing knownMonotone = %d\n", iElem);
			pObjPo = Aig_ManCo( pAig, iElem );
			pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
			pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
					(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
					Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));
			pHintSignalLo = (Aig_Obj_t *)Vec_PtrEntry(vHintMonotoneLocalFlopOutput, iElem - oldPoNum);
			pObjTemp1 = Aig_Or( pNewAig, Aig_And(pNewAig, pObjDriverNew, pHintSignalLo), 
						Aig_And(pNewAig, Aig_Not(pObjDriverNew), Aig_Not(pHintSignalLo)) );
			
			pObjKnownMonotoneAnd = Aig_And( pNewAig, pObjKnownMonotoneAnd, pObjTemp1 );
		}
		pObjPendingAndNextPending = Aig_And( pNewAig, pObjPendingAndNextPending, pObjKnownMonotoneAnd );
	}
	#endif

	vHintMonotoneLocalDriverNew = Vec_PtrAlloc(Vec_IntSize(vHintMonotoneLocal));
	vHintMonotoneLocalProp = Vec_PtrAlloc(Vec_IntSize(vHintMonotoneLocal));
	Vec_IntForEachEntry( vHintMonotoneLocal, iElem, i )
	{
		pObjPo = Aig_ManCo( pAig, iElem );
		pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
		pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

		if( vKnownMonotoneLocal != NULL && Vec_IntFind( vKnownMonotoneLocal, iElem ) != -1 )
		{
			Vec_PtrPush(vHintMonotoneLocalDriverNew, pObjDriverNew);
		}
		else
		{
			poSerialNum = Vec_IntFind( vHintMonotoneLocal, iElem );
			pHintSignalLo = (Aig_Obj_t *)Vec_PtrEntry(vHintMonotoneLocalFlopOutput, poSerialNum );
			pObjTemp1 = Aig_And( pNewAig, pObjPendingAndNextPending, pHintSignalLo);
			pObjTemp2 = Aig_Or( pNewAig, Aig_Not(pObjTemp1), pObjDriverNew );
			//pObjTemp2 = Aig_Or( pNewAig, Aig_Not(pObjTemp1), Aig_ManConst1( pNewAig ));
			//pObjTemp2 = Aig_ManConst1( pNewAig );
			Vec_PtrPush(vHintMonotoneLocalDriverNew, pObjDriverNew);
			Vec_PtrPush(vHintMonotoneLocalProp, pObjTemp2); 
		}
	}

	//********************************************************************
	// Step 9: create primary outputs 
	//********************************************************************
	Saig_ManForEachPo( pAig, pObj, i )
	{
		poCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	*startMonotonePropPo = i;
	Vec_PtrForEachEntry( Aig_Obj_t *, vHintMonotoneLocalProp, pObj, i )
	{
		poCreated++;
		pObjPo = Aig_ObjCreateCo( pNewAig, pObj ); 
	}

	//********************************************************************
	// Step 9: create latch inputs 
	//********************************************************************

	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}
	
	//********************************************************************
	// Step 9.a: create latch input for PENDING_FLOP
	//********************************************************************

	liCreated++;
	Aig_ObjCreateCo( pNewAig, pObjPendingDriverNew );

	//********************************************************************
	// Step 9.b: create latch input for MONOTONE_FLOP
	//********************************************************************

	Vec_PtrForEachEntry( Aig_Obj_t *, vHintMonotoneLocalDriverNew, pObj, i )
	{
		liCreated++;
		Aig_ObjCreateCo( pNewAig, pObj );
	}

	printf("\npoCopied = %d, poCreated = %d\n", poCopied, poCreated);
	printf("\nliCreated++ = %d\n", liCreated );
	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	
	assert( Aig_ManCheck( pNewAig ) );
	assert( loCopied + loCreated == liCopied + liCreated );

	printf("\nSaig_ManPoNum = %d\n", Saig_ManPoNum(pNewAig));
	return pNewAig;
}